

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionCallByName
          (ExpressionContext *ctx,SynBase *source,InplaceStr name,ArrayView<ArgumentData> arguments,
          bool allowFailure,bool allowInternal,bool allowFastLookup)

{
  Allocator *pAVar1;
  FunctionData *pFVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  uint uVar6;
  int iVar7;
  TypeBase *pTVar8;
  IdentifierLookupResult *pIVar9;
  ExprBase *pEVar10;
  ExprBase *pEVar11;
  SynBase *pSVar12;
  size_t sVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var14;
  TypeError *pTVar15;
  byte bVar16;
  char *pcVar17;
  ulong uVar18;
  char *str;
  long lVar19;
  undefined8 unaff_RBP;
  ArgumentData *pAVar20;
  uint uVar21;
  char *pcVar22;
  bool bVar23;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<FunctionValue> functions_00;
  FunctionLookupChain function;
  SmallArray<FunctionValue,_32U> functions;
  FunctionLookupChain local_3f8;
  char *local_3e0;
  undefined8 local_3d8;
  undefined4 uStack_3d0;
  uint uStack_3cc;
  ArgumentData *local_3c8;
  uint uStack_3c0;
  undefined4 uStack_3bc;
  undefined8 local_3b8;
  undefined4 uStack_3b0;
  uint uStack_3ac;
  char *local_3a8;
  char *pcStack_3a0;
  ArgumentData *local_398;
  uint uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  FunctionLookupChain local_360;
  undefined1 local_348 [784];
  Allocator *local_38;
  undefined4 extraout_var_01;
  
  pAVar20 = arguments.data;
  pcVar17 = name.end;
  str = name.begin;
  uVar21 = arguments.count;
  pEVar11 = (ExprBase *)CONCAT71((int7)((ulong)unaff_RBP >> 8),allowInternal);
  auVar3 = arguments._0_12_;
  if (allowFastLookup) {
    pcVar22 = pcVar17;
    pTVar8 = anon_unknown.dwarf_11255e::FindNextTypeFromScope(ctx->scope);
    bVar23 = true;
    if (pTVar8 != (TypeBase *)0x0) {
      uVar6 = NULLC::StringHashContinue(pTVar8->nameHash,"::");
      uVar6 = NULLC::StringHashContinue(uVar6,str,pcVar17);
      pIVar9 = anon_unknown.dwarf_11255e::LookupObjectByName(ctx,uVar6);
      if (((pIVar9 != (IdentifierLookupResult *)0x0) && (pIVar9->function != (FunctionData *)0x0))
         && (auVar4._8_8_ = 0, auVar4._0_8_ = pcVar22,
            pEVar10 = CreateVariableAccess
                                (ctx,source,(IntrusiveList<SynIdentifier>)(auVar4 << 0x40),name,
                                 allowInternal), pEVar10 != (ExprBase *)0x0)) {
        arguments_02._12_4_ = 0;
        arguments_02.data = (ArgumentData *)auVar3._0_8_;
        arguments_02.count = auVar3._8_4_;
        pEVar11 = CreateFunctionCall(ctx,source,pEVar10,arguments_02,allowFailure);
        bVar23 = pEVar11 == (ExprBase *)0x0;
      }
    }
    if (!bVar23) {
      return pEVar11;
    }
    uVar6 = NULLC::GetStringHash(str,pcVar17);
    anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_3f8,ctx,uVar6);
    if (local_3f8.node.node == (Node *)0x0) {
      bVar23 = false;
    }
    else {
      pAVar1 = ctx->allocator;
      memset((ExprBase *)(local_348 + 0x10),0,0x300);
      local_348._8_4_ = 0;
      local_348._12_4_ = 0x20;
      local_348._0_8_ = (ExprBase *)(local_348 + 0x10);
      local_38 = pAVar1;
      while (local_3f8.node.node != (Node *)0x0) {
        pFVar2 = *(FunctionData **)(local_3f8.node.node + 0x10);
        pSVar12 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pSVar12 = (SynBase *)
                  CreateFunctionContextAccess
                            (ctx,pSVar12,*(FunctionData **)(local_3f8.node.node + 0x10));
        if (pSVar12 == (SynBase *)0x0) {
          __assert_fail("context",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                        ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)"
                       );
        }
        if (local_348._8_4_ == local_348._12_4_) {
          SmallArray<FunctionValue,_32U>::grow
                    ((SmallArray<FunctionValue,_32U> *)local_348,local_348._8_4_);
        }
        if ((ExprBase *)local_348._0_8_ == (ExprBase *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
                       );
        }
        uVar18 = (ulong)(uint)local_348._8_4_;
        local_348._8_4_ = local_348._8_4_ + 1;
        ((SynBase **)local_348._0_8_)[uVar18 * 3] = source;
        ((FunctionData **)(local_348._0_8_ + 8))[uVar18 * 3] = pFVar2;
        ((SynBase **)(local_348._0_8_ + 0x10))[uVar18 * 3] = pSVar12;
        anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_360,&local_3f8);
        local_3f8.node.node = local_360.node.node;
      }
      functions_00.count = local_348._8_4_;
      functions_00.data = (FunctionValue *)local_348._0_8_;
      local_378 = 0;
      uStack_370 = 0;
      arguments_00._12_4_ = uStack_38c;
      arguments_00.count = uVar21;
      arguments_00.data = pAVar20;
      functions_00._12_4_ = 0;
      local_398 = pAVar20;
      uStack_390 = uVar21;
      pEVar10 = CreateFunctionCallFinal
                          (ctx,source,(ExprBase *)0x0,functions_00,
                           (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,true);
      bVar23 = pEVar10 != (ExprBase *)0x0;
      if (bVar23) {
        pEVar11 = pEVar10;
      }
      SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_348);
    }
    bVar16 = allowFailure | bVar23;
    if (bVar23 == false) {
      pEVar11 = (ExprBase *)0x0;
    }
  }
  else {
    bVar23 = false;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pcVar17;
    pEVar11 = CreateVariableAccess
                        (ctx,source,(IntrusiveList<SynIdentifier>)(auVar5 << 0x40),name,
                         allowInternal);
    if (pEVar11 == (ExprBase *)0x0) {
      pEVar10 = (ExprBase *)0x0;
    }
    else {
      arguments_03._12_4_ = 0;
      arguments_03.data = (ArgumentData *)auVar3._0_8_;
      arguments_03.count = auVar3._8_4_;
      pEVar10 = CreateFunctionCall(ctx,source,pEVar11,arguments_03,allowFailure);
      bVar23 = pEVar10 != (ExprBase *)0x0;
    }
    bVar16 = allowFailure | bVar23;
    pEVar11 = (ExprBase *)0x0;
    if (bVar23 != false) {
      pEVar11 = pEVar10;
    }
  }
  if (bVar16 == 0) {
    pcVar22 = ctx->errorBuf;
    if ((pcVar22 != (char *)0x0) && (ctx->errorBufSize != 0)) {
      if (ctx->errorCount == 0) {
        ctx->errorPos = (source->pos).begin;
        ctx->errorBufLocation = pcVar22;
      }
      local_3e0 = ctx->errorBufLocation;
      NULLC::SafeSprintf(local_3e0,(ulong)(ctx->errorBufSize + ((int)pcVar22 - (int)local_3e0)),
                         "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                         (ulong)(uint)((int)name.end - (int)name.begin),str);
      pcVar22 = ctx->errorBufLocation;
      sVar13 = strlen(pcVar22);
      pcVar22 = pcVar22 + sVar13;
      ctx->errorBufLocation = pcVar22;
      local_3b8 = 0;
      uStack_3b0 = 0;
      local_388 = 0;
      uStack_380 = 0;
      local_3d8 = 0;
      uStack_3d0 = 0;
      arguments_01._12_4_ = uStack_3bc;
      arguments_01.count = uVar21;
      arguments_01.data = pAVar20;
      local_3c8 = pAVar20;
      uStack_3c0 = uVar21;
      local_3a8 = str;
      pcStack_3a0 = pcVar17;
      ReportOnFunctionSelectError
                (ctx,source,pcVar22,(*(int *)&ctx->errorBuf - (int)pcVar22) + ctx->errorBufSize,
                 local_3e0,name,(ArrayView<FunctionValue>)(ZEXT416(uStack_3ac) << 0x60),
                 (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,
                 (ArrayView<unsigned_int>)(ZEXT416(uStack_3cc) << 0x60),0xffffffff,true);
      pcVar17 = ctx->errorBufLocation;
      sVar13 = strlen(pcVar17);
      ctx->errorBufLocation = pcVar17 + sVar13;
    }
    if (ctx->errorHandlerNested == true) {
      if (ctx->errorHandlerActive != false) {
        longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
      }
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1c38,
                    "ExprBase *CreateFunctionCallByName(ExpressionContext &, SynBase *, InplaceStr, ArrayView<ArgumentData>, bool, bool, bool)"
                   );
    }
    ctx->errorCount = ctx->errorCount + 1;
    local_348._0_8_ = (ExprBase *)0x0;
    local_348._8_4_ = 0;
    local_348._12_4_ = 0;
    if (uVar21 != 0) {
      lVar19 = 0;
      do {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar11 = *(ExprBase **)((long)&pAVar20->value + lVar19);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var,iVar7),pEVar11->source,pEVar11->type,
                   pEVar11);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)local_348,(ExprBase *)CONCAT44(extraout_var,iVar7));
        lVar19 = lVar19 + 0x30;
      } while ((ulong)uVar21 * 0x30 != lVar19);
    }
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar11 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
    pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pp_Var14 = (_func_int **)CONCAT44(extraout_var_01,iVar7);
    pTVar15 = ExpressionContext::GetErrorType(ctx);
    *(undefined4 *)(pp_Var14 + 1) = 0;
    pp_Var14[2] = (_func_int *)source;
    pp_Var14[3] = (_func_int *)pTVar15;
    pp_Var14[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 5) = 0;
    *pp_Var14 = (_func_int *)&PTR__ExprError_003f6638;
    pp_Var14[0xc] = (_func_int *)0x0;
    pp_Var14[6] = (_func_int *)(pp_Var14 + 8);
    pp_Var14[7] = (_func_int *)0x400000000;
    pEVar11->typeID = 0x29;
    pEVar11->source = source;
    pEVar11->type = pTVar8;
    pEVar11->next = (ExprBase *)0x0;
    pEVar11->listed = false;
    pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6a98;
    pEVar11[1]._vptr_ExprBase = pp_Var14;
    *(undefined8 *)&pEVar11[1].typeID = local_348._0_8_;
    pEVar11[1].source = (SynBase *)CONCAT44(local_348._12_4_,local_348._8_4_);
  }
  return pEVar11;
}

Assistant:

ExprBase* CreateFunctionCallByName(ExpressionContext &ctx, SynBase *source, InplaceStr name, ArrayView<ArgumentData> arguments, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	if(allowFastLookup)
	{
		if(TypeBase *nextType = FindNextTypeFromScope(ctx.scope))
		{
			unsigned hash = nextType->nameHash;

			hash = NULLC::StringHashContinue(hash, "::");
			hash = NULLC::StringHashContinue(hash, name.begin, name.end);

			if(LookupFunctionByName(ctx, hash))
			{
				if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
				{
					if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
						return result;
				}
			}
		}

		if(FunctionLookupChain function = LookupFunctionChainByName(ctx, name.hash()))
		{
			// Collect a set of available functions
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			while(function)
			{
				functions.push_back(FunctionValue(source, *function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *function)));

				function = function.next();
			}

			if(ExprBase *result = CreateFunctionCallFinal(ctx, source, NULL, functions, IntrusiveList<TypeHandle>(), arguments, true))
				return result;
		}
	}
	else
	{
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), name, allowInternal))
		{
			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, arguments, allowFailure))
				return result;
		}
	}

	if(!allowFailure)
	{
		IntrusiveList<TypeHandle> generics;
		ArrayView<FunctionValue> functions;
		ArrayView<unsigned> ratings;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = source->pos.begin;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(name));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, name, functions, generics, arguments, ratings, ~0u, true);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()), errorArguments);
	}

	return NULL;
}